

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwlock_test.cpp
# Opt level: O0

void __thiscall
SharedMutexTest_Lock_Test<yamc::alternate::basic_shared_mutex<yamc::rwlock::WriterPrefer>_>::
TestBody(SharedMutexTest_Lock_Test<yamc::alternate::basic_shared_mutex<yamc::rwlock::WriterPrefer>_>
         *this)

{
  anon_class_24_3_2b76d57f_for_f f;
  bool bVar1;
  char *message;
  AssertHelper local_168;
  Message local_160;
  duration<long,_std::ratio<1L,_1000000L>_> local_158;
  int local_150 [2];
  duration<long,_std::ratio<1L,_1000L>_> local_148;
  duration<long,_std::ratio<1L,_1000L>_> local_140;
  undefined1 local_138 [8];
  AssertionResult gtest_ar;
  stopwatch<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>
  local_100;
  stopwatch<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>
  sw;
  basic_shared_mutex<yamc::rwlock::WriterPrefer> local_f0 [4];
  atomic<int> nread;
  undefined1 local_88 [8];
  phaser phaser;
  SharedMutexTest_Lock_Test<yamc::alternate::basic_shared_mutex<yamc::rwlock::WriterPrefer>_>
  *this_local;
  
  phaser.mtx_.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)this;
  yamc::test::phaser::phaser((phaser *)local_88,5);
  yamc::alternate::basic_shared_mutex<yamc::rwlock::WriterPrefer>::basic_shared_mutex(local_f0);
  sw.start_.__d.__r._4_4_ = 0;
  yamc::test::
  stopwatch<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>
  ::stopwatch(&local_100);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )local_88;
  f.mtx = (TypeParam *)local_f0;
  f.phaser = (phaser *)
             gtest_ar.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
  f.nread = (atomic<int> *)((long)&sw.start_.__d.__r + 4);
  yamc::test::
  task_runner<SharedMutexTest_Lock_Test<yamc::alternate::basic_shared_mutex<yamc::rwlock::WriterPrefer>>::TestBody()::_lambda(unsigned_long)_1_>
            (5,f);
  local_150[1] = 200;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_148,local_150 + 1);
  local_150[0] = 2;
  local_140 = std::chrono::operator*(&local_148,local_150);
  local_158 = yamc::test::
              stopwatch<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>
              ::elapsed(&local_100);
  testing::internal::
  CmpHelperLE<std::chrono::duration<long,std::ratio<1l,1000l>>,std::chrono::duration<long,std::ratio<1l,1000000l>>>
            ((internal *)local_138,"std::chrono::milliseconds(200) * 2","sw.elapsed()",&local_140,
             &local_158);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
  if (!bVar1) {
    testing::Message::Message(&local_160);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_138);
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/rwlock_test.cpp"
               ,0x50,message);
    testing::internal::AssertHelper::operator=(&local_168,&local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    testing::Message::~Message(&local_160);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
  yamc::alternate::basic_shared_mutex<yamc::rwlock::WriterPrefer>::~basic_shared_mutex(local_f0);
  yamc::test::phaser::~phaser((phaser *)local_88);
  return;
}

Assistant:

TYPED_TEST(SharedMutexTest, Lock)
{
  yamc::test::phaser phaser(1 + TEST_READER_THREADS);
  TypeParam mtx;
  std::atomic<int> nread = {};
  yamc::test::stopwatch<> sw;
  yamc::test::task_runner(
    1 + TEST_READER_THREADS,
    [&](std::size_t id) {
      auto ph = phaser.get(id);
      if (id == 0) {
        // writer-thread
        ph.await();     // p1
        EXPECT_NO_THROW(mtx.lock());
        EXPECT_EQ(TEST_READER_THREADS, nread);
        WAIT_TICKS;
        EXPECT_NO_THROW(mtx.unlock());
      } else {
        // reader-threads
        ASSERT_NO_THROW(mtx.lock_shared());
        ph.advance(1);  // p1
        ++nread;
        WAIT_TICKS;
        ASSERT_NO_THROW(mtx.unlock_shared());
      }
    });
  EXPECT_LE(TEST_TICKS * 2, sw.elapsed());
}